

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)19>_> * __thiscall
vk::DescriptorSetLayoutBuilder::build
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,
          DescriptorSetLayoutBuilder *this,DeviceInterface *vk,VkDevice device,
          VkDescriptorSetLayoutCreateFlags extraFlags)

{
  pointer pIVar1;
  pointer pHVar2;
  long lVar3;
  long lVar4;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  VkDescriptorSetLayoutCreateInfo createInfo;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  local_68;
  VkDescriptorSetLayoutCreateInfo local_50;
  
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  vector(&local_68,&this->m_bindings);
  pIVar1 = (this->m_immutableSamplerInfos).
           super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->m_immutableSamplerInfos).
                super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    pHVar2 = (this->m_immutableSamplers).
             super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      local_68.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start[pIVar1[lVar4].bindingIndex].pImmutableSamplers =
           pHVar2 + pIVar1[lVar4].samplerBaseIndex;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  local_50.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50.pBindings =
       local_68.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_68.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_68.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    local_50.pBindings = (pointer)0x0;
  }
  local_50.bindingCount =
       (int)((ulong)((long)local_68.
                           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_68.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  local_50.flags = extraFlags;
  createDescriptorSetLayout(__return_storage_ptr__,vk,device,&local_50,(VkAllocationCallbacks *)0x0)
  ;
  if (local_68.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorSetLayout> DescriptorSetLayoutBuilder::build (const DeviceInterface& vk, VkDevice device, VkDescriptorSetLayoutCreateFlags extraFlags) const
{
	// Create new layout bindings with pImmutableSamplers updated
	std::vector<VkDescriptorSetLayoutBinding>	bindings	= m_bindings;

	for (size_t samplerInfoNdx = 0; samplerInfoNdx < m_immutableSamplerInfos.size(); samplerInfoNdx++)
	{
		const ImmutableSamplerInfo&	samplerInfo	= m_immutableSamplerInfos[samplerInfoNdx];

		bindings[samplerInfo.bindingIndex].pImmutableSamplers	= &m_immutableSamplers[samplerInfo.samplerBaseIndex];
	}

	const VkDescriptorSetLayoutCreateInfo		createInfo	=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
		DE_NULL,
		(VkDescriptorSetLayoutCreateFlags)extraFlags,			// flags
		(deUint32)bindings.size(),								// bindingCount
		(bindings.empty()) ? (DE_NULL) : (bindings.data()),		// pBinding
	};

	return createDescriptorSetLayout(vk, device, &createInfo);
}